

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::reset_peer_info(raft_server *this)

{
  _func_int *p_Var1;
  element_type *peVar2;
  long *plVar3;
  undefined8 uVar4;
  int iVar5;
  _func_int **pp_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Node *p_Var8;
  long lVar9;
  undefined4 extraout_var;
  _Atomic_word *this_00;
  ptr<buffer> new_conf_buf;
  ptr<cluster_config> my_next_config;
  ptr<srv_config> my_srv_config;
  ptr<log_entry> entry;
  ptr<cluster_config> c_config;
  log_val_type local_aa;
  undefined1 local_a9;
  undefined1 local_a8 [40];
  undefined1 local_80 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  ptr<log_entry> local_68;
  undefined1 local_58 [48];
  __atomic_base<unsigned_long> local_28;
  
  get_config((raft_server *)local_58);
  uVar4 = local_58._0_8_;
  p_Var1 = *(_func_int **)(local_58._0_8_ + 0x48);
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    iVar5 = (*peVar2->_vptr_logger[7])();
    if (4 < iVar5) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)local_a8,"servers: %zu\n",p_Var1);
      (*peVar2->_vptr_logger[8])
                (peVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"reset_peer_info",0x2ed,local_a8);
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_);
      }
    }
  }
  if (p_Var1 < (_func_int *)0x2) goto LAB_0019a209;
  pp_Var6 = (_func_int **)(uVar4 + 0x38);
  do {
    pp_Var6 = (_func_int **)*pp_Var6;
    if (pp_Var6 == (_func_int **)(uVar4 + 0x38)) {
      local_80._8_8_ = (_func_int *)0x0;
      p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      goto LAB_00199f96;
    }
    local_80._8_8_ = pp_Var6[2];
  } while (*(int *)local_80._8_8_ != this->id_);
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pp_Var6[3];
  if (p_Stack_70 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0019a022:
    local_58._16_8_ = *(undefined8 *)local_58._0_8_;
    local_58._24_8_ = *(_func_int **)(local_58._0_8_ + 8);
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
    p_Var7->_M_use_count = 1;
    p_Var7->_M_weak_count = 1;
    p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001ce830;
    local_a8._32_8_ = p_Var7 + 1;
    p_Var7[1]._vptr__Sp_counted_base = (_func_int **)local_58._16_8_;
    p_Var7[1]._M_use_count = local_58._24_4_;
    p_Var7[1]._M_weak_count = local_58._28_4_;
    *(undefined1 *)&p_Var7[2]._vptr__Sp_counted_base = 0;
    *(_Atomic_word **)&p_Var7[2]._M_use_count = &p_Var7[3]._M_use_count;
    p_Var7[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(undefined1 *)&p_Var7[3]._M_use_count = 0;
    this_00 = &p_Var7[4]._M_use_count;
    p_Var7[5]._vptr__Sp_counted_base = (_func_int **)this_00;
    *(_Atomic_word **)&p_Var7[4]._M_use_count = this_00;
    p_Var7[5]._M_use_count = 0;
    p_Var7[5]._M_weak_count = 0;
    local_80._0_8_ = p_Var7;
    p_Var8 = std::__cxx11::
             list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>
             ::_M_create_node<std::shared_ptr<nuraft::srv_config>const&>
                       ((list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>
                         *)this_00,(shared_ptr<nuraft::srv_config> *)(local_80 + 8));
    std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
    uVar4 = local_a8._32_8_;
    *(long *)&p_Var7[5]._M_use_count = *(long *)&p_Var7[5]._M_use_count + 1;
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,*(_func_int **)(local_58._0_8_ + 0x18),
               *(_func_int **)(local_58._0_8_ + 0x20) + (long)*(_func_int **)(local_58._0_8_ + 0x18)
              );
    std::__cxx11::string::_M_assign
              ((string *)
               &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar4 + 0x10))->_M_use_count);
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_);
    }
    *(undefined1 *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_a8._32_8_ + 0x10))->
      _vptr__Sp_counted_base = *(undefined1 *)(local_58._0_8_ + 0x10);
    set_config(this,(ptr<cluster_config> *)(local_a8 + 0x20));
    plVar3 = *(long **)&(((this->ctx_)._M_t.
                          super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                          .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->state_mgr_
                        ).super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
    (**(code **)(*plVar3 + 0x18))(plVar3,local_a8._32_8_);
    cluster_config::serialize((cluster_config *)local_a8);
    local_28._M_i =
         (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->term_).super___atomic_base<unsigned_long>._M_i;
    local_aa = conf;
    lVar9 = std::chrono::_V2::system_clock::now();
    local_58._40_8_ = lVar9 / 1000;
    local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
              (&local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(log_entry **)&local_68,(allocator<nuraft::log_entry> *)&local_a9,
               &local_28._M_i,(shared_ptr<nuraft::buffer> *)local_a8,&local_aa,
               (unsigned_long *)(local_58 + 0x28));
    iVar5 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[2])();
    store_log_entry(this,&local_68,CONCAT44(extraout_var,iVar5) - 1);
    if (local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._0_8_);
    }
  }
  else {
    if (__libc_single_threaded != '\0') {
      p_Stack_70->_M_use_count = p_Stack_70->_M_use_count + 1;
      goto LAB_0019a022;
    }
    LOCK();
    p_Stack_70->_M_use_count = p_Stack_70->_M_use_count + 1;
    UNLOCK();
    if ((_func_int *)local_80._8_8_ != (_func_int *)0x0) goto LAB_0019a022;
LAB_00199f96:
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      iVar5 = (*peVar2->_vptr_logger[7])();
      if (2 < iVar5) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)local_a8,"my_srv_config is NULL");
        (*peVar2->_vptr_logger[8])
                  (peVar2,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"reset_peer_info",0x2f4,local_a8);
        if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
          operator_delete((void *)local_a8._0_8_);
        }
      }
    }
  }
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
  }
LAB_0019a209:
  if ((element_type *)local_58._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  return;
}

Assistant:

void raft_server::reset_peer_info() {
    ptr<cluster_config> c_config = get_config();
    auto const srv_cnt = c_config->get_servers().size();
    p_db("servers: %zu\n", srv_cnt);
    if (srv_cnt > 1) {
        ptr<srv_config> my_srv_config = c_config->get_server(id_);
        if (!my_srv_config) {
            // It means that this node was removed, and then
            // added again (it shouldn't happen though).
            // Just return.
            p_wn("my_srv_config is NULL");
            return;
        }

        ptr<cluster_config> my_next_config = cs_new<cluster_config>
            ( c_config->get_log_idx(), c_config->get_prev_log_idx() );
        my_next_config->get_servers().push_back(my_srv_config);
        my_next_config->set_user_ctx( c_config->get_user_ctx() );
        my_next_config->set_async_replication
                        ( c_config->is_async_replication() );

        set_config(my_next_config);
        ctx_->state_mgr_->save_config(*my_next_config);

        // Make its local temporary log for configuration.
        // It will be rolled back and overwritten if this node
        // re-joins the cluster.
        ptr<buffer> new_conf_buf(my_next_config->serialize());
        ptr<log_entry> entry(cs_new<log_entry>(
            state_->get_term(), new_conf_buf, log_val_type::conf,
            timer_helper::get_timeofday_us()));
        store_log_entry(entry, log_store_->next_slot()-1);
    }
}